

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O2

trie_value trie_remove(trie t,vector keys)

{
  trie_value pvVar1;
  int iVar2;
  trie_node n;
  
  if ((t != (trie)0x0) && (n = trie_node_get(t,keys), n != (trie_node)0x0)) {
    pvVar1 = n->value;
    iVar2 = trie_node_clear(t,n);
    if (iVar2 == 0) {
      return pvVar1;
    }
  }
  return (trie_value)0x0;
}

Assistant:

trie_value trie_remove(trie t, vector keys)
{
	if (t != NULL)
	{
		trie_node n = trie_node_get(t, keys);

		if (n != NULL)
		{
			trie_value value = n->value;

			if (trie_node_clear(t, n) == 0)
			{
				return value;
			}
		}
	}

	return NULL;
}